

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

QString * QInputDialog::getItem
                    (QString *__return_storage_ptr__,QWidget *parent,QString *title,QString *label,
                    QStringList *items,int current,bool editable,bool *ok,WindowFlags flags,
                    InputMethodHints inputMethodHints)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  int iVar5;
  QInputDialog *this;
  long in_FS_OFFSET;
  QAutoPointer<QInputDialog> local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::value((QString *)&local_58,items,(long)current);
  local_68.o.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.o.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QInputDialog *)operator_new(0x28);
  QInputDialog(this,parent,flags);
  QPointer<QInputDialog>::QPointer<void>(&local_68.o,this);
  QWidget::setWindowTitle((QWidget *)local_68.o.wp.value,title);
  setLabelText((QInputDialog *)local_68.o.wp.value,label);
  setComboBoxItems((QInputDialog *)local_68.o.wp.value,items);
  setTextValue((QInputDialog *)local_68.o.wp.value,(QString *)&local_58);
  setComboBoxEditable((QInputDialog *)local_68.o.wp.value,editable);
  QWidget::setInputMethodHints((QWidget *)local_68.o.wp.value,inputMethodHints);
  iVar5 = (**(code **)(*(long *)local_68.o.wp.value + 0x1a8))();
  if (ok != (bool *)0x0) {
    *ok = iVar5 != 0;
  }
  bVar4 = QAutoPointer::operator_cast_to_bool((QAutoPointer *)&local_68);
  qVar3 = local_58.size;
  pcVar2 = local_58.ptr;
  pDVar1 = local_58.d;
  if (iVar5 == 0 || !bVar4) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_58.size = 0;
    (__return_storage_ptr__->d).size = qVar3;
  }
  else {
    textValue(__return_storage_ptr__,(QInputDialog *)local_68.o.wp.value);
  }
  QAutoPointer<QInputDialog>::~QAutoPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QInputDialog::getItem(QWidget *parent, const QString &title, const QString &label,
                              const QStringList &items, int current, bool editable, bool *ok,
                              Qt::WindowFlags flags, Qt::InputMethodHints inputMethodHints)
{
    QString text(items.value(current));

    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setComboBoxItems(items);
    dialog->setTextValue(text);
    dialog->setComboBoxEditable(editable);
    dialog->setInputMethodHints(inputMethodHints);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->textValue();
    } else {
        return text;
    }
}